

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeMaxObj(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i,
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *newVal,bool scale)

{
  long *plVar1;
  byte in_CL;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffef0;
  undefined1 local_ec [80];
  undefined1 local_9c [83];
  byte local_49;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_49 = in_CL & 1;
  if (local_49 == 0) {
    local_8 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::maxObj_w(in_RDX,in_stack_fffffffffffffeec);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_RDX,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  else {
    plVar1 = *(long **)(in_RDI + 0x1e8);
    local_28 = local_ec;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffef0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    (**(code **)(*plVar1 + 0x148))(local_9c,plVar1,in_RDI,in_ESI,local_ec);
    local_18 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::maxObj_w(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    local_20 = local_9c;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffef0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  return;
}

Assistant:

virtual void changeMaxObj(int i, const R& newVal, bool scale = false)
   {
      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::maxObj_w(i) = lp_scaler->scaleObj(*this, i, newVal);
      }
      else
         LPColSetBase<R>::maxObj_w(i) = newVal;

      assert(isConsistent());
   }